

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O1

int32 __thiscall mkvmuxer::MkvWriter::Write(MkvWriter *this,void *buffer,uint32 length)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = -1;
  if ((FILE *)this->file_ != (FILE *)0x0) {
    if (length == 0) {
      return 0;
    }
    if (buffer != (void *)0x0) {
      sVar2 = fwrite(buffer,1,(ulong)length,(FILE *)this->file_);
      iVar1 = -(uint)(sVar2 != length);
    }
  }
  return iVar1;
}

Assistant:

int32 MkvWriter::Write(const void* buffer, uint32 length) {
  if (!file_)
    return -1;

  if (length == 0)
    return 0;

  if (buffer == NULL)
    return -1;

  const size_t bytes_written = fwrite(buffer, 1, length, file_);

  return (bytes_written == length) ? 0 : -1;
}